

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_value_tmp_tests.hpp
# Opt level: O3

string * __thiscall
iutest::tr1::
ValueTmpParamTestInstance<iu_TestValueType_x_iutest_x_Equal_Test,iutest::detail::VariadicTypeList<iutest::TemplateValue<10l>,iutest::TemplateValue<0l>>>
::MakeTestSuiteName_abi_cxx11_
          (string *__return_storage_ptr__,
          ValueTmpParamTestInstance<iu_TestValueType_x_iutest_x_Equal_Test,iutest::detail::VariadicTypeList<iutest::TemplateValue<10l>,iutest::TemplateValue<0l>>>
          *this,char *testsuite,size_t index)

{
  iu_stringstream strm;
  long *local_1b8;
  long local_1a8 [2];
  allocator<char> local_198 [16];
  undefined1 local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)this,local_198);
  std::__cxx11::stringstream::stringstream((stringstream *)local_198);
  std::ostream::_M_insert<unsigned_long>((ulong)local_188);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_1b8);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8,local_1a8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

static ::std::string MakeTestSuiteName(const char* testsuite, size_t index)
    {
        ::std::string name = testsuite;
        iu_stringstream strm; strm << index;
        name += "/";
        name += strm.str();
        return name;
    }